

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<QShaderDescription::InOutVariable>::appendInitialize
          (QArrayDataPointer<QShaderDescription::InOutVariable> *this,qsizetype newSize)

{
  InOutVariable *pIVar1;
  long in_RSI;
  InOutVariable *in_RDI;
  InOutVariable *e;
  InOutVariable *b;
  
  begin((QArrayDataPointer<QShaderDescription::InOutVariable> *)0x6ed600);
  pIVar1 = begin((QArrayDataPointer<QShaderDescription::InOutVariable> *)0x6ed616);
  std::uninitialized_value_construct<QShaderDescription::InOutVariable*>(pIVar1 + in_RSI,in_RDI);
  (in_RDI->name).d.size = in_RSI;
  return;
}

Assistant:

void appendInitialize(qsizetype newSize)
    {
        Q_ASSERT(this->isMutable());
        Q_ASSERT(!this->isShared());
        Q_ASSERT(newSize > this->size);
        Q_ASSERT(newSize - this->size <= this->freeSpaceAtEnd());

        T *const b = this->begin() + this->size;
        T *const e = this->begin() + newSize;
        q17::uninitialized_value_construct(b, e);
        this->size = newSize;
    }